

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

hts_idx_t * sam_index_load(samFile *fp,char *fn)

{
  htsExactFormat hVar1;
  int iVar2;
  hts_cram_idx_t *idx;
  char *fn_local;
  samFile *fp_local;
  
  hVar1 = (fp->format).format;
  if (hVar1 == bam) {
    fp_local = (samFile *)hts_idx_load(fn,1);
  }
  else if (hVar1 == cram) {
    iVar2 = cram_index_load((fp->fp).cram,fn);
    if (iVar2 < 0) {
      fp_local = (samFile *)0x0;
    }
    else {
      fp_local = (samFile *)malloc(0x10);
      if (fp_local == (samFile *)0x0) {
        fp_local = (samFile *)0x0;
      }
      else {
        *(undefined4 *)fp_local = 3;
        fp_local->lineno = (int64_t)fp->fp;
      }
    }
  }
  else {
    fp_local = (samFile *)0x0;
  }
  return (hts_idx_t *)fp_local;
}

Assistant:

hts_idx_t *sam_index_load(samFile *fp, const char *fn)
{
    switch (fp->format.format) {
    case bam:
        return bam_index_load(fn);

    case cram: {
        if (cram_index_load(fp->fp.cram, fn) < 0) return NULL;
        // Cons up a fake "index" just pointing at the associated cram_fd:
        hts_cram_idx_t *idx = malloc(sizeof (hts_cram_idx_t));
        if (idx == NULL) return NULL;
        idx->fmt = HTS_FMT_CRAI;
        idx->cram = fp->fp.cram;
        return (hts_idx_t *) idx;
        }

    default:
        return NULL; // TODO Would use tbx_index_load if it returned hts_idx_t
    }
}